

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O2

bool icu_63::double_conversion::AdvanceToNonspace<unsigned_short_const*>
               (unsigned_short **current,unsigned_short *end)

{
  bool bVar1;
  ushort *puVar2;
  
  puVar2 = *current;
  while (puVar2 != end) {
    bVar1 = isWhitespace((uint)*puVar2);
    if (!bVar1) break;
    puVar2 = puVar2 + 1;
    *current = puVar2;
  }
  return puVar2 != end;
}

Assistant:

static inline bool AdvanceToNonspace(Iterator* current, Iterator end) {
  while (*current != end) {
    if (!isWhitespace(**current)) return true;
    ++*current;
  }
  return false;
}